

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

void Gia_ManEquivFilterTest(Gia_Man_t *p)

{
  Vec_Int_t *p_00;
  int *piVar1;
  int iVar2;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar1 = (int *)malloc(4000);
  p_00->pArray = piVar1;
  iVar2 = 2;
  do {
    Vec_IntPush(p_00,(p->vCos->nSize - p->nRegs) + iVar2);
    printf("%d ",(ulong)(uint)((p->vCos->nSize - p->nRegs) + iVar2));
    iVar2 = iVar2 + 2;
  } while (iVar2 != 0x16);
  putchar(10);
  Gia_ManEquivFilter(p,p_00,1);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  return;
}

Assistant:

void Gia_ManEquivFilterTest( Gia_Man_t * p )
{
    Vec_Int_t * vPoIds;
    int i;
    vPoIds = Vec_IntAlloc( 1000 );
    for ( i = 0; i < 10; i++ )
    {
        Vec_IntPush( vPoIds, Gia_ManPoNum(p) + 2 * i + 2 );
        printf( "%d ", Gia_ManPoNum(p) + 2*i + 2 );
    }
    printf( "\n" );
    Gia_ManEquivFilter( p, vPoIds, 1 );
    Vec_IntFree( vPoIds );
}